

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> * __thiscall
tinyusdz::GeomMesh::get_points
          (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  value_type *this_00;
  undefined1 local_90 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> val;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  pv;
  TimeSampleInterpolationType interp_local;
  double time_local;
  GeomMesh *this_local;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *dst;
  
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
            (__return_storage_ptr__);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
          ::authored(&this->points);
  if (((bVar1) &&
      (bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
               ::is_blocked(&this->points), !bVar1)) &&
     (bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              ::is_connection(&this->points), !bVar1)) {
    TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
    ::get_value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                 *)&val.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->points);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                      ((optional *)
                       &val.
                        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_90);
      this_00 = nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                         *)&val.
                            super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              ::get(this_00,time,
                    (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                    local_90,interp);
      if (bVar1) {
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::operator=
                  (__return_storage_ptr__,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   local_90);
      }
      std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
                ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_90);
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
    ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                 *)&val.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::point3f> GeomMesh::get_points(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::point3f> dst;

  if (!points.authored() || points.is_blocked()) {
    return dst;
  }

  if (points.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = points.get_value()) {
    std::vector<value::point3f> val;
    if (pv.value().get(time, &val, interp)) {
      dst = std::move(val);
    }
  }

  return dst;
}